

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O0

Arities __thiscall wabt::ModuleContext::GetExprArity(ModuleContext *this,Expr *expr)

{
  FILE *pFVar1;
  ExprType EVar2;
  Index IVar3;
  Index IVar4;
  Enum EVar5;
  BlockExprBase<(wabt::ExprType)7> *pBVar6;
  VarExpr<(wabt::ExprType)8> *pVVar7;
  VarExpr<(wabt::ExprType)9> *pVVar8;
  BrTableExpr *pBVar9;
  VarExpr<(wabt::ExprType)12> *pVVar10;
  VarExpr<(wabt::ExprType)38> *pVVar11;
  CallIndirectExpr *pCVar12;
  ReturnCallIndirectExpr *pRVar13;
  IfExpr *pIVar14;
  BlockExprBase<(wabt::ExprType)25> *pBVar15;
  VarExpr<(wabt::ExprType)54> *pVVar16;
  size_type sVar17;
  TryExpr *pTVar18;
  SimdLaneOpExpr *pSVar19;
  char *pcVar20;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 uVar21;
  Arities AVar22;
  Opcode local_6c;
  Event *pEStack_68;
  Opcode opcode;
  Event *event;
  Index operand_count;
  VarExpr<(wabt::ExprType)54> *throw_;
  ReturnCallIndirectExpr *rci_expr;
  CallIndirectExpr *ci_expr;
  Var *var_1;
  Var *var;
  Index arity;
  Expr *expr_local;
  ModuleContext *this_local;
  undefined4 uStack_10;
  undefined1 local_c;
  
  EVar2 = Expr::type(expr);
  pFVar1 = _stderr;
  switch(EVar2) {
  case AtomicLoad:
  case Convert:
  case Load:
  case LocalTee:
  case MemoryGrow:
  case RefIsNull:
  case TableGet:
  case Unary:
    Arities::Arities((Arities *)((long)&this_local + 4),1,1,false);
    uVar21 = extraout_RDX_14;
    break;
  case AtomicRmw:
  case AtomicNotify:
  case Binary:
  case Compare:
  case TableGrow:
    Arities::Arities((Arities *)((long)&this_local + 4),2,1,false);
    uVar21 = extraout_RDX;
    break;
  case AtomicRmwCmpxchg:
  case AtomicWait:
  case Select:
    Arities::Arities((Arities *)((long)&this_local + 4),3,1,false);
    uVar21 = extraout_RDX_21;
    break;
  case AtomicStore:
  case Store:
  case TableSet:
    Arities::Arities((Arities *)((long)&this_local + 4),2,0,false);
    uVar21 = extraout_RDX_00;
    break;
  case Block:
    pBVar6 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(expr);
    IVar4 = FuncSignature::GetNumResults(&(pBVar6->block).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),0,IVar4,false);
    uVar21 = extraout_RDX_01;
    break;
  case Br:
    pVVar7 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(expr);
    IVar4 = GetLabelArity(this,&pVVar7->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar4,1,true);
    uVar21 = extraout_RDX_02;
    break;
  case BrIf:
    pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(expr);
    IVar4 = GetLabelArity(this,&pVVar8->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar4 + 1,IVar4,false);
    uVar21 = extraout_RDX_03;
    break;
  case BrOnExn:
    Arities::Arities((Arities *)((long)&this_local + 4),1,1,false);
    uVar21 = extraout_RDX_04;
    break;
  case BrTable:
    pBVar9 = cast<wabt::BrTableExpr,wabt::Expr>(expr);
    IVar4 = GetLabelArity(this,&pBVar9->default_target);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar4 + 1,1,true);
    uVar21 = extraout_RDX_05;
    break;
  case Call:
    pVVar10 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(expr);
    IVar4 = GetFuncParamCount(this,&pVVar10->var);
    IVar3 = GetFuncResultCount(this,&pVVar10->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar4,IVar3,false);
    uVar21 = extraout_RDX_06;
    break;
  case CallIndirect:
    pCVar12 = cast<wabt::CallIndirectExpr,wabt::Expr>(expr);
    IVar4 = FuncDeclaration::GetNumParams(&pCVar12->decl);
    IVar3 = FuncDeclaration::GetNumResults(&pCVar12->decl);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar4 + 1,IVar3,false);
    uVar21 = extraout_RDX_08;
    break;
  case Const:
  case GlobalGet:
  case LocalGet:
  case MemorySize:
  case RefFunc:
  case RefNull:
  case TableSize:
    Arities::Arities((Arities *)((long)&this_local + 4),0,1,false);
    uVar21 = extraout_RDX_10;
    break;
  case Drop:
  case GlobalSet:
  case LocalSet:
    Arities::Arities((Arities *)((long)&this_local + 4),1,0,false);
    uVar21 = extraout_RDX_15;
    break;
  case If:
    pIVar14 = cast<wabt::IfExpr,wabt::Expr>(expr);
    IVar4 = FuncSignature::GetNumResults(&(pIVar14->true_).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),1,IVar4,false);
    uVar21 = extraout_RDX_16;
    break;
  case Loop:
    pBVar15 = cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(expr);
    IVar4 = FuncSignature::GetNumResults(&(pBVar15->block).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),0,IVar4,false);
    uVar21 = extraout_RDX_17;
    break;
  case MemoryCopy:
  case MemoryFill:
  case MemoryInit:
  case TableCopy:
  case TableInit:
    Arities::Arities((Arities *)((long)&this_local + 4),3,0,false);
    uVar21 = extraout_RDX_13;
    break;
  case DataDrop:
  case ElemDrop:
    Arities::Arities((Arities *)((long)&this_local + 4),0,0,false);
    uVar21 = extraout_RDX_12;
    break;
  case Nop:
    Arities::Arities((Arities *)((long)&this_local + 4),0,0,false);
    uVar21 = extraout_RDX_18;
    break;
  case Rethrow:
    Arities::Arities((Arities *)((long)&this_local + 4),0,0,true);
    uVar21 = extraout_RDX_20;
    break;
  case Return:
    sVar17 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                       (&(this->current_func_->decl).sig.result_types);
    Arities::Arities((Arities *)((long)&this_local + 4),(Index)sVar17,1,true);
    uVar21 = extraout_RDX_19;
    break;
  case ReturnCall:
    pVVar11 = cast<wabt::VarExpr<(wabt::ExprType)38>,wabt::Expr>(expr);
    IVar4 = GetFuncParamCount(this,&pVVar11->var);
    IVar3 = GetFuncResultCount(this,&pVVar11->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar4,IVar3,true);
    uVar21 = extraout_RDX_07;
    break;
  case ReturnCallIndirect:
    pRVar13 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(expr);
    IVar4 = FuncDeclaration::GetNumParams(&pRVar13->decl);
    IVar3 = FuncDeclaration::GetNumResults(&pRVar13->decl);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar4 + 1,IVar3,true);
    uVar21 = extraout_RDX_09;
    break;
  case SimdLaneOp:
    pSVar19 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(expr);
    local_6c.enum_ = (pSVar19->opcode).enum_;
    EVar5 = Opcode::operator_cast_to_Enum(&local_6c);
    pFVar1 = _stderr;
    if (EVar5 - I8X16ExtractLaneS < 2) {
LAB_001f7312:
      Arities::Arities((Arities *)((long)&this_local + 4),1,1,false);
      uVar21 = extraout_RDX_25;
    }
    else {
      if (EVar5 != I8X16ReplaceLane) {
        if (EVar5 - I16X8ExtractLaneS < 2) goto LAB_001f7312;
        if (EVar5 != I16X8ReplaceLane) {
          if (EVar5 == I32X4ExtractLane) goto LAB_001f7312;
          if (EVar5 != I32X4ReplaceLane) {
            if (EVar5 == I64X2ExtractLane) goto LAB_001f7312;
            if (EVar5 != I64X2ReplaceLane) {
              if (EVar5 == F32X4ExtractLane) goto LAB_001f7312;
              if (EVar5 != F32X4ReplaceLane) {
                if (EVar5 == F64X2ExtractLane) goto LAB_001f7312;
                if (EVar5 != F64X2ReplaceLane) {
                  pcVar20 = GetExprTypeName(expr);
                  fprintf(pFVar1,"Invalid Opcode for expr type: %s\n",pcVar20);
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir-util.cc"
                                ,0xfc,
                                "ModuleContext::Arities wabt::ModuleContext::GetExprArity(const Expr &) const"
                               );
                }
              }
            }
          }
        }
      }
      Arities::Arities((Arities *)((long)&this_local + 4),2,1,false);
      uVar21 = extraout_RDX_26;
    }
    break;
  case SimdShuffleOp:
    Arities::Arities((Arities *)((long)&this_local + 4),2,1,false);
    uVar21 = extraout_RDX_27;
    break;
  default:
    pcVar20 = GetExprTypeName(expr);
    fprintf(pFVar1,"bad expr type: %s\n",pcVar20);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir-util.cc"
                  ,0x106,
                  "ModuleContext::Arities wabt::ModuleContext::GetExprArity(const Expr &) const");
  case Ternary:
    Arities::Arities((Arities *)((long)&this_local + 4),3,1,false);
    uVar21 = extraout_RDX_24;
    break;
  case Throw:
    pVVar16 = cast<wabt::VarExpr<(wabt::ExprType)54>,wabt::Expr>(expr);
    event._4_4_ = 0;
    pEStack_68 = Module::GetEvent(this->module,&pVVar16->var);
    if (pEStack_68 != (Event *)0x0) {
      sVar17 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                         (&(pEStack_68->decl).sig.param_types);
      event._4_4_ = (Index)sVar17;
    }
    Arities::Arities((Arities *)((long)&this_local + 4),event._4_4_,0,true);
    uVar21 = extraout_RDX_22;
    break;
  case Try:
    pTVar18 = cast<wabt::TryExpr,wabt::Expr>(expr);
    IVar4 = FuncSignature::GetNumResults(&(pTVar18->block).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),0,IVar4,false);
    uVar21 = extraout_RDX_23;
    break;
  case Last:
    Arities::Arities((Arities *)((long)&this_local + 4),0,1,true);
    uVar21 = extraout_RDX_11;
  }
  AVar22._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar21 >> 8),local_c);
  AVar22.nargs = this_local._4_4_;
  AVar22.nreturns = uStack_10;
  return AVar22;
}

Assistant:

ModuleContext::Arities ModuleContext::GetExprArity(const Expr& expr) const {
  switch (expr.type()) {
    case ExprType::AtomicNotify:
    case ExprType::AtomicRmw:
    case ExprType::Binary:
    case ExprType::Compare:
    case ExprType::TableGrow:
      return { 2, 1 };

    case ExprType::AtomicStore:
    case ExprType::Store:
    case ExprType::TableSet:
      return { 2, 0 };

    case ExprType::Block:
      return { 0, cast<BlockExpr>(&expr)->block.decl.sig.GetNumResults() };

    case ExprType::Br:
      return { GetLabelArity(cast<BrExpr>(&expr)->var), 1, true };

    case ExprType::BrIf: {
      Index arity = GetLabelArity(cast<BrIfExpr>(&expr)->var);
      return { arity + 1, arity };
    }

    case ExprType::BrOnExn:
      return { 1, 1 };

    case ExprType::BrTable:
      return { GetLabelArity(cast<BrTableExpr>(&expr)->default_target) + 1, 1,
               true };

    case ExprType::Call: {
      const Var& var = cast<CallExpr>(&expr)->var;
      return { GetFuncParamCount(var), GetFuncResultCount(var) };
    }

    case ExprType::ReturnCall: {
      const Var& var = cast<ReturnCallExpr>(&expr)->var;
      return { GetFuncParamCount(var), GetFuncResultCount(var), true };
    }

    case ExprType::CallIndirect: {
      const auto* ci_expr = cast<CallIndirectExpr>(&expr);
      return { ci_expr->decl.GetNumParams() + 1,
               ci_expr->decl.GetNumResults() };
    }

    case ExprType::ReturnCallIndirect: {
      const auto* rci_expr = cast<ReturnCallIndirectExpr>(&expr);
      return { rci_expr->decl.GetNumParams() + 1,
               rci_expr->decl.GetNumResults(), true };
    }

    case ExprType::Const:
    case ExprType::GlobalGet:
    case ExprType::LocalGet:
    case ExprType::MemorySize:
    case ExprType::TableSize:
    case ExprType::RefNull:
    case ExprType::RefFunc:
      return { 0, 1 };

    case ExprType::Unreachable:
      return { 0, 1, true };

    case ExprType::DataDrop:
    case ExprType::ElemDrop:
      return { 0, 0 };

    case ExprType::MemoryInit:
    case ExprType::TableInit:
    case ExprType::MemoryFill:
    case ExprType::MemoryCopy:
    case ExprType::TableCopy:
      return { 3, 0 };

    case ExprType::AtomicLoad:
    case ExprType::Convert:
    case ExprType::Load:
    case ExprType::LocalTee:
    case ExprType::MemoryGrow:
    case ExprType::Unary:
    case ExprType::TableGet:
    case ExprType::RefIsNull:
      return { 1, 1 };

    case ExprType::Drop:
    case ExprType::GlobalSet:
    case ExprType::LocalSet:
      return { 1, 0 };

    case ExprType::If:
      return { 1, cast<IfExpr>(&expr)->true_.decl.sig.GetNumResults() };

    case ExprType::Loop:
      return { 0, cast<LoopExpr>(&expr)->block.decl.sig.GetNumResults() };

    case ExprType::Nop:
      return { 0, 0 };

    case ExprType::Return:
      return
        { static_cast<Index>(current_func_->decl.sig.result_types.size()), 1,
          true };

    case ExprType::Rethrow:
      return { 0, 0, true };

    case ExprType::AtomicRmwCmpxchg:
    case ExprType::AtomicWait:
    case ExprType::Select:
      return { 3, 1 };

    case ExprType::Throw: {
      auto throw_ = cast<ThrowExpr>(&expr);
      Index operand_count = 0;
      if (Event* event = module.GetEvent(throw_->var)) {
        operand_count = event->decl.sig.param_types.size();
      }
      return { operand_count, 0, true };
    }

    case ExprType::Try:
      return { 0, cast<TryExpr>(&expr)->block.decl.sig.GetNumResults() };
      break;

    case ExprType::Ternary:
      return { 3, 1 };

    case ExprType::SimdLaneOp: {
      const Opcode opcode = cast<SimdLaneOpExpr>(&expr)->opcode;
      switch (opcode) {
        case Opcode::I8X16ExtractLaneS:
        case Opcode::I8X16ExtractLaneU:
        case Opcode::I16X8ExtractLaneS:
        case Opcode::I16X8ExtractLaneU:
        case Opcode::I32X4ExtractLane:
        case Opcode::I64X2ExtractLane:
        case Opcode::F32X4ExtractLane:
        case Opcode::F64X2ExtractLane:
          return { 1, 1 };

        case Opcode::I8X16ReplaceLane:
        case Opcode::I16X8ReplaceLane:
        case Opcode::I32X4ReplaceLane:
        case Opcode::I64X2ReplaceLane:
        case Opcode::F32X4ReplaceLane:
        case Opcode::F64X2ReplaceLane:
          return { 2, 1 };

        default:
          fprintf(stderr, "Invalid Opcode for expr type: %s\n",
                  GetExprTypeName(expr));
          assert(0);
          return { 0, 0 };
      }
    }

    case ExprType::SimdShuffleOp:
      return { 2, 1 };

    default:
      fprintf(stderr, "bad expr type: %s\n", GetExprTypeName(expr));
      assert(0);
      return { 0, 0 };
  }
}